

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

TokenList * __thiscall
slang::BumpAllocator::emplace<slang::syntax::TokenList,slang::syntax::TokenList_const&>
          (BumpAllocator *this,TokenList *args)

{
  TokenList *pTVar1;
  TokenList *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pTVar1 = (TokenList *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::TokenList::TokenList(in_RSI,pTVar1);
  return pTVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }